

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall GlobOpt::CollectMemOpStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *pFVar7;
  
  if ((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x864,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict"
                      );
    if (!bVar2) goto LAB_0044cd9e;
    *puVar5 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x865,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) {
LAB_0044cd9e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
  pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,MemSetPhase,uVar3,uVar4);
  if ((!bVar2) && (bVar2 = CollectMemsetStElementI(this,instr,loop), bVar2)) {
    return true;
  }
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
  pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,MemCopyPhase,uVar3,uVar4);
  if (bVar2) {
    return false;
  }
  bVar2 = CollectMemcopyStElementI(this,instr,loop);
  return bVar2;
}

Assistant:

bool
GlobOpt::CollectMemOpStElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict);
    Assert(instr->GetSrc1());
    return (!PHASE_OFF(Js::MemSetPhase, this->func) && CollectMemsetStElementI(instr, loop)) ||
        (!PHASE_OFF(Js::MemCopyPhase, this->func) && CollectMemcopyStElementI(instr, loop));
}